

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O3

_Bool trans_VMOV_imm_dp(DisasContext_conflict1 *s,arg_VMOV_imm_dp *a)

{
  uint uVar1;
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var2;
  TCGv_i64 pTVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  TCGTemp *ts;
  
  uVar1 = s->isar->mvfr0;
  if (((uVar1 & 0xe00) == 0) || (uVar5 = a->vd, (uVar5 & 0x10) != 0 && (uVar1 & 0xe) == 0)) {
LAB_00660073:
    _Var2 = false;
  }
  else {
    tcg_ctx = s->uc->tcg_ctx;
    iVar4 = s->vec_len;
    if ((uVar1 & 0xf000000) == 0) {
      if (iVar4 != 0) goto LAB_00660073;
      iVar6 = 0;
      if (s->vec_stride != 0) {
        return false;
      }
      _Var2 = full_vfp_access_check(s,false);
      iVar4 = 0;
      if (!_Var2) {
        return true;
      }
    }
    else {
      iVar6 = 0;
      _Var2 = full_vfp_access_check(s,false);
      if (!_Var2) {
        return true;
      }
      if (0 < iVar4) {
        if ((uVar5 & 0xc) == 0) {
          iVar6 = 0;
          iVar4 = 0;
        }
        else {
          iVar6 = (s->vec_stride >> 1) + 1;
        }
      }
    }
    uVar1 = a->imm;
    pTVar3 = tcg_const_i64_aarch64
                       (tcg_ctx,(ulong)((uint)((uVar1 & 0x40) == 0) * 0x40 +
                                        (uVar1 & 0x3f | (uVar1 & 0x80) << 8) + 0x3fc0) << 0x30);
    ts = (TCGTemp *)(pTVar3 + (long)tcg_ctx);
    tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_st_i64,(TCGArg)ts,
                        (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),
                        (ulong)(uVar5 >> 1) * 0x100 + (ulong)(uVar5 & 1) * 8 + 0xc10);
    for (; iVar4 != 0; iVar4 = iVar4 + -1) {
      uVar1 = uVar5 + iVar6;
      uVar5 = uVar5 & 0xfffffffc | uVar1 & 3;
      tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_st_i64,(TCGArg)ts,
                          (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),
                          (ulong)(uVar5 >> 1) * 0x100 + (ulong)(uVar1 & 1) * 8 + 0xc10);
    }
    tcg_temp_free_internal_aarch64(tcg_ctx,ts);
    _Var2 = true;
  }
  return _Var2;
}

Assistant:

static bool trans_VMOV_imm_dp(DisasContext *s, arg_VMOV_imm_dp *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    uint32_t delta_d = 0;
    int veclen = s->vec_len;
    TCGv_i64 fd;
    uint32_t vd;

    vd = a->vd;

    if (!dc_isar_feature(aa32_fpdp_v3, s)) {
        return false;
    }

    /* UNDEF accesses to D16-D31 if they don't exist. */
    if (!dc_isar_feature(aa32_simd_r32, s) && (vd & 0x10)) {
        return false;
    }

    if (!dc_isar_feature(aa32_fpshvec, s) &&
        (veclen != 0 || s->vec_stride != 0)) {
        return false;
    }

    if (!vfp_access_check(s)) {
        return true;
    }

    if (veclen > 0) {
        /* Figure out what type of vector operation this is.  */
        if (vfp_dreg_is_scalar(vd)) {
            /* scalar */
            veclen = 0;
        } else {
            delta_d = (s->vec_stride >> 1) + 1;
        }
    }

    fd = tcg_const_i64(tcg_ctx, vfp_expand_imm(MO_64, a->imm));

    for (;;) {
        neon_store_reg64(tcg_ctx, fd, vd);

        if (veclen == 0) {
            break;
        }

        /* Set up the operands for the next iteration */
        veclen--;
        vd = vfp_advance_dreg(vd, delta_d);
    }

    tcg_temp_free_i64(tcg_ctx, fd);
    return true;
}